

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void stbtt__csctx_rccurve_to
               (stbtt__csctx *ctx,float dx1,float dy1,float dx2,float dy2,float dx3,float dy3)

{
  long in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float in_XMM5_Da;
  float cy2;
  float cx2;
  float cy1;
  float cx1;
  stbtt_int32 in_stack_ffffffffffffffbc;
  stbtt_int32 in_stack_ffffffffffffffc4;
  stbtt_int32 in_stack_ffffffffffffffc8;
  stbtt_uint8 in_stack_ffffffffffffffcf;
  
  fVar1 = *(float *)(in_RDI + 0x10) + in_XMM0_Da + in_XMM2_Da;
  fVar2 = *(float *)(in_RDI + 0x14) + in_XMM1_Da + in_XMM3_Da;
  *(float *)(in_RDI + 0x10) = fVar1 + in_XMM4_Da;
  *(float *)(in_RDI + 0x14) = fVar2 + in_XMM5_Da;
  stbtt__csctx_v((stbtt__csctx *)CONCAT44(fVar1,fVar2),in_stack_ffffffffffffffcf,
                 in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,(int)fVar2,
                 in_stack_ffffffffffffffbc,(stbtt_int32)in_XMM5_Da,(stbtt_int32)in_XMM3_Da);
  return;
}

Assistant:

static void stbtt__csctx_rccurve_to(stbtt__csctx *ctx, float dx1, float dy1, float dx2, float dy2, float dx3, float dy3)
{
float cx1 = ctx->x + dx1;
float cy1 = ctx->y + dy1;
float cx2 = cx1 + dx2;
float cy2 = cy1 + dy2;
ctx->x = cx2 + dx3;
ctx->y = cy2 + dy3;
stbtt__csctx_v(ctx, STBTT_vcubic, (int)ctx->x, (int)ctx->y, (int)cx1, (int)cy1, (int)cx2, (int)cy2);
}